

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O1

bool __thiscall duckdb_re2::Regexp::ParseState::PushDollar(ParseState *this)

{
  ParseFlags PVar1;
  ParseFlags oflags;
  
  PVar1 = this->flags_;
  if ((PVar1 & OneLine) == NoParseFlags) {
    PushSimpleOp(this,kRegexpEndLine);
  }
  else {
    this->flags_ = PVar1 | WasDollar;
    PushSimpleOp(this,kRegexpEndText);
    this->flags_ = PVar1;
  }
  return true;
}

Assistant:

bool Regexp::ParseState::PushDollar() {
  if (flags_ & OneLine) {
    // Clumsy marker so that MimicsPCRE() can tell whether
    // this kRegexpEndText was a $ and not a \z.
    Regexp::ParseFlags oflags = flags_;
    flags_ = flags_ | WasDollar;
    bool ret = PushSimpleOp(kRegexpEndText);
    flags_ = oflags;
    return ret;
  }
  return PushSimpleOp(kRegexpEndLine);
}